

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar * __thiscall
icu_63::Normalizer2Impl::findPreviousCompBoundary
          (Normalizer2Impl *this,UChar *start,UChar *p,UBool onlyContiguous)

{
  UChar UVar1;
  uint16_t norm16;
  UBool UVar2;
  int iVar3;
  UChar *pUVar4;
  UCPTrie *trie;
  uint c;
  
  while( true ) {
    if (p == start) {
      return p;
    }
    pUVar4 = p + -1;
    UVar1 = p[-1];
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if ((pUVar4 == start || ((ushort)UVar1 >> 10 & 1) == 0) || ((p[-2] & 0xfc00U) != 0xd800)) {
        trie = this->normTrie;
        iVar3 = trie->dataLength + -1;
      }
      else {
        pUVar4 = p + -2;
        c = c + (uint)(ushort)p[-2] * 0x400 + 0xfca02400;
        trie = this->normTrie;
        if ((int)c < trie->highStart) {
          iVar3 = ucptrie_internalSmallIndex_63(trie,c);
          trie = this->normTrie;
        }
        else {
          iVar3 = trie->dataLength + -2;
        }
      }
    }
    else {
      trie = this->normTrie;
      iVar3 = (c & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
    }
    norm16 = *(uint16_t *)((long)(trie->data).ptr0 + (long)iVar3 * 2);
    UVar2 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous);
    if (UVar2 != '\0') break;
    UVar2 = hasCompBoundaryBefore(this,c,norm16);
    p = pUVar4;
    if (UVar2 != '\0') {
      return pUVar4;
    }
  }
  return p;
}

Assistant:

const UChar *Normalizer2Impl::findPreviousCompBoundary(const UChar *start, const UChar *p,
                                                       UBool onlyContiguous) const {
    while (p != start) {
        const UChar *codePointLimit = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
        if (norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return codePointLimit;
        }
        if (hasCompBoundaryBefore(c, norm16)) {
            return p;
        }
    }
    return p;
}